

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

void __thiscall Darts::Details::DoubleArrayBuilder::fix_all_blocks(DoubleArrayBuilder *this)

{
  ulong uVar1;
  id_type iVar2;
  id_type block_id;
  id_type block_id_00;
  
  uVar1 = (this->units_).size_;
  iVar2 = (id_type)(uVar1 >> 8);
  block_id_00 = 0;
  if (0x10ff < uVar1) {
    block_id_00 = iVar2 - 0x10;
  }
  for (; iVar2 != block_id_00; block_id_00 = block_id_00 + 1) {
    fix_block(this,block_id_00);
  }
  return;
}

Assistant:

inline void DoubleArrayBuilder::fix_all_blocks() {
  id_type begin = 0;
  if (num_blocks() > NUM_EXTRA_BLOCKS) {
    begin = num_blocks() - NUM_EXTRA_BLOCKS;
  }
  id_type end = num_blocks();

  for (id_type block_id = begin; block_id != end; ++block_id) {
    fix_block(block_id);
  }
}